

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O2

void __thiscall PrettyPrinter::visit(PrettyPrinter *this,BlockStmt *node)

{
  pointer puVar1;
  Stmt *pSVar2;
  ostream *poVar3;
  unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_> *statement;
  pointer puVar4;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"{");
  std::endl<char,std::char_traits<char>>(poVar3);
  puVar1 = (node->m_statements).
           super__Vector_base<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (node->m_statements).
                super__Vector_base<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>,_std::allocator<std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    std::operator<<((ostream *)&std::cout,"    ");
    pSVar2 = (puVar4->_M_t).super___uniq_ptr_impl<AST::Stmt,_std::default_delete<AST::Stmt>_>._M_t.
             super__Tuple_impl<0UL,_AST::Stmt_*,_std::default_delete<AST::Stmt>_>.
             super__Head_base<0UL,_AST::Stmt_*,_false>._M_head_impl;
    (*pSVar2->_vptr_Stmt[2])(pSVar2,this);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"};");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void PrettyPrinter::visit(AST::BlockStmt *node) {
    std::cout << "{" << std::endl;
    for (auto& statement : node->m_statements) {
        std::cout << "    ";
        statement->accept(this);
    }
    std::cout << "};" << std::endl;
}